

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

const_iterator __thiscall
QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
          (QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *this,GestureType *key)

{
  _Rb_tree_color _Var1;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  bool bVar6;
  
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                 *)0x0) {
    cVar3._M_node = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    cVar3._M_node = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      _Var1 = *key;
      cVar5._M_node = cVar3._M_node;
      do {
        bVar6 = p_Var4[1]._M_color < _Var1;
        if (!bVar6) {
          cVar5._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar6];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (cVar5._M_node != cVar3._M_node) {
        if (cVar5._M_node[1]._M_color <= _Var1) {
          cVar3._M_node = cVar5._M_node;
        }
        return (const_iterator)cVar3._M_node;
      }
    }
  }
  return (const_iterator)cVar3._M_node;
}

Assistant:

constexpr P get() const noexcept { return ptr; }